

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::EventFunctionChecker::visit(EventFunctionChecker *this,Processor *p)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  Function *pFVar5;
  EndpointDetails *this_00;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 o;
  pointer pTVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *extraout_RDX;
  long *extraout_RDX_00;
  long *plVar12;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  pointer ppVar13;
  Identifier *in_R9;
  pointer ppVar14;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pointer ppVar15;
  pointer ppVar16;
  pointer ppVar17;
  pointer other;
  Type *t_1;
  Type *other_00;
  Type eventType;
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  DuplicateNameChecker duplicateNameChecker;
  undefined2 uVar18;
  bool bVar19;
  bool bVar20;
  PrimitiveType PVar21;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  pointer local_190;
  vector<soul::Type,_std::allocator<soul::Type>_> local_188;
  long *local_170;
  DuplicateNameChecker local_168;
  pointer local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  long *plVar11;
  
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  local_168.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = (*(p->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[8])(p);
  plVar11 = (long *)CONCAT44(extraout_var,iVar10);
  if (plVar11 != extraout_RDX) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,*(string **)(*plVar11 + 0x30),(Context *)(*plVar11 + 0x10));
      plVar11 = plVar11 + 1;
    } while (plVar11 != extraout_RDX);
  }
  ppVar15 = (p->stateVariables).
            super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (p->stateVariables).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != ppVar1) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,(ppVar15->object->name).name,
                 &(ppVar15->object->super_Statement).super_ASTObject.context);
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar1);
  }
  ppVar16 = (p->super_ProcessorBase).super_ModuleBase.structures.
            super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (p->super_ProcessorBase).super_ModuleBase.structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar16 != ppVar2) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,(ppVar16->object->super_TypeDeclarationBase).name.name,
                 &(ppVar16->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                  super_ASTObject.context);
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 != ppVar2);
  }
  ppVar17 = (p->super_ProcessorBase).super_ModuleBase.usings.
            super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (p->super_ProcessorBase).super_ModuleBase.usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar17 != ppVar3) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,(ppVar17->object->super_TypeDeclarationBase).name.name,
                 &(ppVar17->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                  super_ASTObject.context);
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 != ppVar3);
  }
  ppVar14 = (p->functions).
            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar13 = (p->functions).
            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar14 != ppVar13) {
    local_150 = ppVar13;
    do {
      if (ppVar14->object->eventFunction == true) {
        iVar10 = (*(p->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[8])();
        plVar11 = (long *)CONCAT44(extraout_var_00,iVar10);
        if (plVar11 == extraout_RDX_00) {
LAB_0023aeb8:
          pFVar5 = ppVar14->object;
          CompileMessageHelpers::createMessage<soul::Identifier&>
                    (&local_148,(CompileMessageHelpers *)0x1,none,0x2ae1c2,(char *)&pFVar5->name,
                     in_R9);
          AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_148,false);
        }
        bVar19 = false;
        plVar12 = extraout_RDX_00;
        local_190 = ppVar14;
        local_170 = extraout_RDX_00;
        do {
          lVar4 = *plVar11;
          if ((*(char *)(lVar4 + 0x28) == '\x01') &&
             (pFVar5 = ppVar14->object, *(string **)(lVar4 + 0x30) == (pFVar5->name).name)) {
            this_00 = *(EndpointDetails **)(lVar4 + 0x38);
            if (this_00 == (EndpointDetails *)0x0) {
              throwInternalCompilerError("object != nullptr","operator*",0x3b);
            }
            if ((this_00->arraySize).object == (Expression *)0x0) {
              if ((long)(pFVar5->parameters).
                        super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pFVar5->parameters).
                        super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_0023ade7;
              AST::VariableDeclaration::getType
                        ((Type *)local_1b0,
                         ((ppVar14->object->parameters).
                          super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->object);
              uVar7 = local_1a0._M_allocated_capacity;
              if ((Structure *)local_1a0._M_allocated_capacity != (Structure *)0x0) {
                *(int *)local_1a0._M_allocated_capacity =
                     *(int *)local_1a0._M_allocated_capacity + 1;
                *(int *)local_1a0._M_allocated_capacity =
                     *(int *)local_1a0._M_allocated_capacity + 1;
              }
              uVar18 = (undefined2)local_1b0._0_4_;
              bVar20 = false;
              bVar19 = false;
              PVar21.type = local_1b0._4_4_;
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_1a0._M_allocated_capacity);
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_1a0._M_allocated_capacity);
              AST::EndpointDetails::getResolvedDataTypes(&local_188,this_00);
              pTVar8 = local_188.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              other = local_188.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                      super__Vector_impl_data._M_start;
              while ((other != pTVar8 &&
                     (bVar9 = Type::isEqual((Type *)&stack0xfffffffffffffe28,other,0), !bVar9))) {
                other = other + 1;
              }
              if (other == pTVar8) {
                pFVar5 = ppVar14->object;
                Type::getDescription_abi_cxx11_
                          ((string *)local_1b0,(Type *)&stack0xfffffffffffffe28);
                CompileMessageHelpers::createMessage<soul::Identifier&,std::__cxx11::string>
                          (&local_68,(CompileMessageHelpers *)0x1,none,0x2ae132,
                           (char *)&pFVar5->name,(Identifier *)local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(PVar21.type,CONCAT13(bVar20,CONCAT12(bVar19,uVar18))));
                AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_68,false);
              }
              std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_188);
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)uVar7);
              bVar19 = true;
              plVar12 = local_170;
            }
            else {
              if ((long)(pFVar5->parameters).
                        super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pFVar5->parameters).
                        super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x10) {
LAB_0023ade7:
                CompileMessageHelpers::createMessage<>
                          (&local_110,syntax,error,"Event function arguments invalid");
                AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_110,false);
              }
              AST::VariableDeclaration::getType
                        ((Type *)local_1b0,
                         ((ppVar14->object->parameters).
                          super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->object);
              uVar7 = local_1a0._M_allocated_capacity;
              uVar6 = local_1b0._4_4_;
              if ((Structure *)local_1a0._M_allocated_capacity != (Structure *)0x0) {
                *(int *)local_1a0._M_allocated_capacity =
                     *(int *)local_1a0._M_allocated_capacity + 2;
              }
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_1a0._M_allocated_capacity);
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_1a0._M_allocated_capacity);
              AST::VariableDeclaration::getType
                        ((Type *)local_1b0,
                         (ppVar14->object->parameters).
                         super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].object);
              o = local_1a0._M_allocated_capacity;
              if ((Structure *)local_1a0._M_allocated_capacity != (Structure *)0x0) {
                *(int *)local_1a0._M_allocated_capacity =
                     *(int *)local_1a0._M_allocated_capacity + 1;
                *(int *)local_1a0._M_allocated_capacity =
                     *(int *)local_1a0._M_allocated_capacity + 1;
              }
              uVar18 = (undefined2)local_1b0._0_4_;
              bVar20 = false;
              bVar19 = false;
              PVar21.type = local_1b0._4_4_;
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_1a0._M_allocated_capacity);
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_1a0._M_allocated_capacity);
              AST::EndpointDetails::getResolvedDataTypes(&local_188,this_00);
              pTVar8 = local_188.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              other_00 = local_188.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              if (1 < uVar6 - int32) {
                pFVar5 = local_190->object;
                CompileMessageHelpers::createMessage<>
                          (&local_a0,syntax,error,
                           "Event Handlers for event arrays need a first argument index integer type"
                          );
                AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_a0,false);
              }
              while ((other_00 != pTVar8 &&
                     (bVar9 = Type::isEqual((Type *)&stack0xfffffffffffffe28,other_00,0), !bVar9)))
              {
                other_00 = other_00 + 1;
              }
              if (other_00 == pTVar8) {
                pFVar5 = local_190->object;
                Type::getDescription_abi_cxx11_
                          ((string *)local_1b0,(Type *)&stack0xfffffffffffffe28);
                CompileMessageHelpers::createMessage<soul::Identifier&,std::__cxx11::string>
                          (&local_d8,(CompileMessageHelpers *)0x1,none,0x2ae132,
                           (char *)&pFVar5->name,(Identifier *)local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(PVar21.type,CONCAT13(bVar20,CONCAT12(bVar19,uVar18))));
                AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_d8,false);
              }
              std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_188);
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)o);
              bVar19 = true;
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)uVar7);
              plVar12 = local_170;
              ppVar14 = local_190;
            }
          }
          plVar11 = plVar11 + 1;
        } while (plVar11 != plVar12);
        ppVar13 = local_150;
        if (!bVar19) goto LAB_0023aeb8;
      }
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 != ppVar13);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168.names);
  return;
}

Assistant:

void visit (AST::Processor& p) override
        {
            super::visit (p);

            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& e : p.getEndpoints())   duplicateNameChecker.check (e->name, e->context);
            for (auto& v : p.stateVariables)   duplicateNameChecker.check (v->name, v->context);
            for (auto& s : p.structures)       duplicateNameChecker.check (s->name, s->context);
            for (auto& u : p.usings)           duplicateNameChecker.check (u->name, u->context);

            // (functions must be scanned last)
            for (auto& f : p.functions)
            {
                if (f->isEventFunction())
                {
                    bool nameFound = false;

                    for (auto& e : p.getEndpoints())
                    {
                        if (e->isInput && e->name == f->name)
                        {
                            nameFound = true;
                            const auto& details = e->getDetails();

                            if (details.arraySize == nullptr && f->parameters.size() == 1)
                            {
                                auto eventType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! eventType.isPresentIn (types))
                                    f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else if (details.arraySize != nullptr && f->parameters.size() == 2)
                            {
                                auto indexType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto eventType = f->parameters.back()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! indexType.isInteger())
                                    f->context.throwError (Errors::eventFunctionIndexInvalid());

                               if (! eventType.isPresentIn (types))
                                   f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else
                            {
                                f->context.throwError (Errors::eventFunctionInvalidArguments());
                            }
                        }
                   }

                    if (! nameFound)
                        f->context.throwError (Errors::noSuchInputEvent (f->name));
                }
            }
        }